

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

IdList * sqlite3IdListAppend(Parse *pParse,IdList *pList,Token *pToken)

{
  int iVar1;
  sqlite3 *db_00;
  char *pcVar2;
  IdList *pNew;
  int i;
  sqlite3 *db;
  Token *pToken_local;
  IdList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pList == (IdList *)0x0) {
    pToken_local = (Token *)sqlite3DbMallocZero(db_00,0x18);
    if (pToken_local == (Token *)0x0) {
      return (IdList *)0x0;
    }
  }
  else {
    pToken_local = (Token *)sqlite3DbRealloc(db_00,pList,(long)pList->nId * 0x10 + 0x18);
    if (pToken_local == (Token *)0x0) {
      sqlite3IdListDelete(db_00,pList);
      return (IdList *)0x0;
    }
  }
  iVar1 = *(int *)&pToken_local->z;
  *(int *)&pToken_local->z = iVar1 + 1;
  pcVar2 = sqlite3NameFromToken(db_00,pToken);
  *(char **)&pToken_local[iVar1].n = pcVar2;
  if ((1 < pParse->eParseMode) && (*(long *)&pToken_local[iVar1].n != 0)) {
    sqlite3RenameTokenMap(pParse,*(void **)&pToken_local[iVar1].n,pToken);
  }
  return (IdList *)pToken_local;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(Parse *pParse, IdList *pList, Token *pToken){
  sqlite3 *db = pParse->db;
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }else{
    IdList *pNew;
    pNew = sqlite3DbRealloc(db, pList,
                 sizeof(IdList) + pList->nId*sizeof(pList->a));
    if( pNew==0 ){
      sqlite3IdListDelete(db, pList);
      return 0;
    }
    pList = pNew;
  }
  i = pList->nId++;
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  if( IN_RENAME_OBJECT && pList->a[i].zName ){
    sqlite3RenameTokenMap(pParse, (void*)pList->a[i].zName, pToken);
  }
  return pList;
}